

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.h
# Opt level: O2

void __thiscall
llbuild::buildsystem::ShellCommand::getShortDescription
          (ShellCommand *this,SmallVectorImpl<char> *result)

{
  StringRef Str;
  raw_svector_ostream local_40;
  
  llvm::raw_svector_ostream::raw_svector_ostream(&local_40,result);
  Str.Data = (this->super_ExternalCommand).description._M_dataplus._M_p;
  Str.Length = (this->super_ExternalCommand).description._M_string_length;
  llvm::raw_ostream::operator<<((raw_ostream *)&local_40,Str);
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&local_40);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << getDescription();
  }